

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_info.hpp
# Opt level: O0

string * __thiscall
iutest::TestInfo::test_name_with_where_abi_cxx11_(string *__return_storage_ptr__,TestInfo *this)

{
  char *pcVar1;
  TestInfo *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  pcVar1 = value_param(this);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", where GetParam() = ");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)&this->m_value_param);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string test_name_with_where() const
    {
        ::std::string str = m_testname;
        if( value_param() != NULL )
        {
            str += ", where GetParam() = ";
            str += m_value_param;
        }
        return str;
    }